

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

char_int_type __thiscall
nlohmann::json_abi_v3_11_3::detail::
lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::get(lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      *this)

{
  size_t *psVar1;
  int iVar2;
  byte *pbVar3;
  uint uVar4;
  char local_9;
  
  (this->position).chars_read_total = (this->position).chars_read_total + 1;
  (this->position).chars_read_current_line = (this->position).chars_read_current_line + 1;
  if (this->next_unget == true) {
    this->next_unget = false;
  }
  else {
    pbVar3 = (byte *)(this->ia).current._M_current;
    if (pbVar3 == (byte *)(this->ia).end._M_current) {
      uVar4 = 0xffffffff;
    }
    else {
      uVar4 = (uint)*pbVar3;
      (this->ia).current._M_current = (char *)(pbVar3 + 1);
    }
    this->current = uVar4;
  }
  if (this->current != -1) {
    local_9 = (char)this->current;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(&this->token_string,&local_9);
  }
  iVar2 = this->current;
  if (iVar2 == 10) {
    psVar1 = &(this->position).lines_read;
    *psVar1 = *psVar1 + 1;
    (this->position).chars_read_current_line = 0;
  }
  return iVar2;
}

Assistant:

char_int_type get()
{
++position.chars_read_total;
++position.chars_read_current_line;

if (next_unget)
{
// just reset the next_unget variable and work with current
next_unget = false;
}
else
{
current = ia.get_character();
}

if (JSON_HEDLEY_LIKELY(current != char_traits<char_type>::eof()))
{
token_string.push_back(char_traits<char_type>::to_char_type(current));
}

if (current == '\n')
{
++position.lines_read;
position.chars_read_current_line = 0;
}

return current;
}